

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerStep *
sqlite3TriggerUpdateStep(sqlite3 *db,Token *pTableName,ExprList *pEList,Expr *pWhere,u8 orconf)

{
  TriggerStep *pTVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  
  pTVar1 = triggerStepAllocate(db,'k',pTableName);
  if (pTVar1 != (TriggerStep *)0x0) {
    pEVar2 = sqlite3ExprListDup(db,pEList,1);
    pTVar1->pExprList = pEVar2;
    pEVar3 = exprDup(db,pWhere,1,(u8 **)0x0);
    pTVar1->pWhere = pEVar3;
    pTVar1->orconf = orconf;
  }
  sqlite3ExprListDelete(db,pEList);
  sqlite3ExprDelete(db,pWhere);
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerUpdateStep(
  sqlite3 *db,         /* The database connection */
  Token *pTableName,   /* Name of the table to be updated */
  ExprList *pEList,    /* The SET clause: list of column and new values */
  Expr *pWhere,        /* The WHERE clause */
  u8 orconf            /* The conflict algorithm. (OE_Abort, OE_Ignore, etc) */
){
  TriggerStep *pTriggerStep;

  pTriggerStep = triggerStepAllocate(db, TK_UPDATE, pTableName);
  if( pTriggerStep ){
    pTriggerStep->pExprList = sqlite3ExprListDup(db, pEList, EXPRDUP_REDUCE);
    pTriggerStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
    pTriggerStep->orconf = orconf;
  }
  sqlite3ExprListDelete(db, pEList);
  sqlite3ExprDelete(db, pWhere);
  return pTriggerStep;
}